

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_sofa_c.c
# Opt level: O0

void t_atoc13(int *status)

{
  int iVar1;
  int j;
  double dc;
  double rc;
  double ob2;
  double ob1;
  double wl;
  double rh;
  double tc;
  double phpa;
  double yp;
  double xp;
  double hm;
  double phi;
  double elong;
  double dut1;
  double utc2;
  double utc1;
  double in_stack_000000d0;
  double in_stack_000000d8;
  double in_stack_000000e0;
  double in_stack_000000e8;
  double in_stack_000000f0;
  double in_stack_000000f8;
  int *piVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  double dVar7;
  double in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  
  piVar2 = (int *)0x3e90976447c1c661;
  pcVar3 = (char *)0x3ebea45923821ba1;
  piVar4 = (int *)0x4086d80000000000;
  pcVar5 = (char *)0x402999999999999a;
  pcVar6 = (char *)0x3fe2e147ae147ae1;
  dVar7 = 0.55;
  iVar1 = iauAtoc13((char *)utc1,utc2,dut1,elong,phi,hm,xp,yp,phpa,in_stack_000000d0,
                    in_stack_000000d8,in_stack_000000e0,in_stack_000000e8,in_stack_000000f0,
                    in_stack_000000f8,(double *)tc,(double *)rh);
  vvd((double)CONCAT44(iVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,dVar7,pcVar6,
      pcVar5,piVar4);
  vvd((double)CONCAT44(iVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,dVar7,pcVar6,
      pcVar5,piVar4);
  viv((int)((ulong)pcVar5 >> 0x20),(int)pcVar5,(char *)piVar4,pcVar3,piVar2);
  piVar2 = (int *)0x3e90976447c1c661;
  pcVar3 = (char *)0x3ebea45923821ba1;
  piVar4 = (int *)0x4086d80000000000;
  pcVar5 = (char *)0x402999999999999a;
  pcVar6 = (char *)0x3fe2e147ae147ae1;
  dVar7 = 0.55;
  iVar1 = iauAtoc13((char *)utc1,utc2,dut1,elong,phi,hm,xp,yp,phpa,in_stack_000000d0,
                    in_stack_000000d8,in_stack_000000e0,in_stack_000000e8,in_stack_000000f0,
                    in_stack_000000f8,(double *)tc,(double *)rh);
  vvd((double)CONCAT44(iVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,dVar7,pcVar6,
      pcVar5,piVar4);
  vvd((double)CONCAT44(iVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,dVar7,pcVar6,
      pcVar5,piVar4);
  viv((int)((ulong)pcVar5 >> 0x20),(int)pcVar5,(char *)piVar4,pcVar3,piVar2);
  piVar2 = (int *)0x3e90976447c1c661;
  pcVar3 = (char *)0x3ebea45923821ba1;
  piVar4 = (int *)0x4086d80000000000;
  pcVar5 = (char *)0x402999999999999a;
  pcVar6 = (char *)0x3fe2e147ae147ae1;
  dVar7 = 0.55;
  iVar1 = iauAtoc13((char *)utc1,utc2,dut1,elong,phi,hm,xp,yp,phpa,in_stack_000000d0,
                    in_stack_000000d8,in_stack_000000e0,in_stack_000000e8,in_stack_000000f0,
                    in_stack_000000f8,(double *)tc,(double *)rh);
  vvd((double)CONCAT44(iVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,dVar7,pcVar6,
      pcVar5,piVar4);
  vvd((double)CONCAT44(iVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,dVar7,pcVar6,
      pcVar5,piVar4);
  viv((int)((ulong)pcVar5 >> 0x20),(int)pcVar5,(char *)piVar4,pcVar3,piVar2);
  return;
}

Assistant:

static void t_atoc13(int *status)
/*
**  - - - - - - - - -
**   t _ a t o c 1 3
**  - - - - - - - - -
**
**  Test iauAtoc13 function.
**
**  Returned:
**     status    int         FALSE = success, TRUE = fail
**
**  Called:  iauAtoc13, vvd, viv
**
**  This revision:  2021 January 5
*/
{
   double utc1, utc2, dut1,
          elong, phi, hm, xp, yp, phpa, tc, rh, wl,
          ob1, ob2, rc, dc;
   int j;


   utc1 = 2456384.5;
   utc2 = 0.969254051;
   dut1 = 0.1550675;
   elong = -0.527800806;
   phi = -1.2345856;
   hm = 2738.0;
   xp = 2.47230737e-7;
   yp = 1.82640464e-6;
   phpa = 731.0;
   tc = 12.8;
   rh = 0.59;
   wl = 0.55;

   ob1 = 2.710085107986886201;
   ob2 = 0.1717653435758265198;
   j = iauAtoc13 ( "R", ob1, ob2, utc1, utc2, dut1,
                   elong, phi, hm, xp, yp, phpa, tc, rh, wl,
                   &rc, &dc);
   vvd(rc, 2.709956744659136129, 1e-12, "iauAtoc13", "R/rc", status);
   vvd(dc, 0.1741696500898471362, 1e-12, "iauAtoc13", "R/dc", status);
   viv(j, 0, "iauAtoc13", "R/j", status);

   ob1 = -0.09247619879782006106;
   ob2 = 0.1717653435758265198;
   j = iauAtoc13 ( "H", ob1, ob2, utc1, utc2, dut1,
                   elong, phi, hm, xp, yp, phpa, tc, rh, wl,
                   &rc, &dc);
   vvd(rc, 2.709956744659734086, 1e-12, "iauAtoc13", "H/rc", status);
   vvd(dc, 0.1741696500898471362, 1e-12, "iauAtoc13", "H/dc", status);
   viv(j, 0, "iauAtoc13", "H/j", status);

   ob1 = 0.09233952224794989993;
   ob2 = 1.407758704513722461;
   j = iauAtoc13 ( "A", ob1, ob2, utc1, utc2, dut1,
                   elong, phi, hm, xp, yp, phpa, tc, rh, wl,
                   &rc, &dc);
   vvd(rc, 2.709956744659734086, 1e-12, "iauAtoc13", "A/rc", status);
   vvd(dc, 0.1741696500898471366, 1e-12, "iauAtoc13", "A/dc", status);
   viv(j, 0, "iauAtoc13", "A/j", status);

}